

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs::function&,cs::callable::types>
          (holder<cs::callable> *this,function *args,types *args_1)

{
  types type;
  baseHolder *in_RDI;
  function *in_stack_ffffffffffffffb8;
  callable *in_stack_ffffffffffffffc0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_003b6050;
  type = (types)((ulong)(in_RDI + 1) >> 0x20);
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs::function&,void>(&in_stack_ffffffffffffffc0->mFunc,in_stack_ffffffffffffffb8);
  cs::callable::callable(in_stack_ffffffffffffffc0,(function_type *)in_stack_ffffffffffffffb8,type);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
            0x2e9ccf);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}